

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clufactor.hpp
# Opt level: O1

int __thiscall
soplex::
CLUFactor<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
::solveUpdateLeft(CLUFactor<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                  *this,number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                        *eps,
                 number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                 *vec,int *nonz,int n)

{
  undefined8 uVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  int iVar5;
  cpp_dec_float<50U,_int,_void> *pcVar6;
  long lVar7;
  int iVar8;
  cpp_dec_float<50U,_int,_void> *v;
  cpp_dec_float<50U,_int,_void> *pcVar9;
  uint *puVar10;
  int *piVar11;
  bool bVar12;
  type t;
  int local_16c;
  cpp_dec_float<50U,_int,_void> local_168;
  undefined1 local_128 [16];
  uint local_118 [3];
  undefined3 uStack_10b;
  uint local_108;
  undefined3 uStack_103;
  uint local_100;
  bool local_fc;
  undefined8 local_f8;
  long local_e8;
  cpp_dec_float<50U,_int,_void> local_e0;
  int *local_a8;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_a0;
  int *local_98;
  pointer local_90;
  int *local_88;
  int *local_80;
  long local_78;
  long local_70;
  cpp_dec_float<50U,_int,_void> local_68;
  
  iVar5 = (this->l).firstUpdate;
  local_78 = (long)iVar5;
  iVar8 = (this->l).firstUnused;
  local_e8 = (long)iVar8;
  local_16c = n;
  if (iVar5 < iVar8) {
    local_90 = (this->l).val.
               super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
    local_98 = (this->l).idx;
    local_80 = (this->l).row;
    local_88 = (this->l).start;
    local_a8 = nonz;
    local_a0 = eps;
    do {
      iVar5 = local_80[local_e8 + -1];
      lVar7 = (long)iVar5;
      local_70 = lVar7 * 0x38;
      uVar1 = *(undefined8 *)(vec[lVar7].m_backend.data._M_elems + 8);
      local_168.data._M_elems[8] = (uint)uVar1;
      local_168.data._M_elems[9] = (uint)((ulong)uVar1 >> 0x20);
      uVar1 = *(undefined8 *)vec[lVar7].m_backend.data._M_elems;
      uVar2 = *(undefined8 *)(vec[lVar7].m_backend.data._M_elems + 2);
      puVar10 = vec[lVar7].m_backend.data._M_elems + 4;
      uVar3 = *(undefined8 *)puVar10;
      uVar4 = *(undefined8 *)(puVar10 + 2);
      local_168.data._M_elems[4] = (uint)uVar3;
      local_168.data._M_elems[5] = (uint)((ulong)uVar3 >> 0x20);
      local_168.data._M_elems[6] = (uint)uVar4;
      local_168.data._M_elems[7] = (uint)((ulong)uVar4 >> 0x20);
      local_168.data._M_elems[0] = (uint)uVar1;
      local_168.data._M_elems[1] = (uint)((ulong)uVar1 >> 0x20);
      local_168.data._M_elems[2] = (uint)uVar2;
      local_168.data._M_elems[3] = (uint)((ulong)uVar2 >> 0x20);
      local_168.exp = vec[lVar7].m_backend.exp;
      local_168.neg = vec[lVar7].m_backend.neg;
      local_e0.fpclass = vec[lVar7].m_backend.fpclass;
      local_e0.prec_elem = vec[lVar7].m_backend.prec_elem;
      local_168.prec_elem = local_e0.prec_elem;
      local_168.fpclass = local_e0.fpclass;
      local_e0.data._M_elems[9] = vec[lVar7].m_backend.data._M_elems[9];
      puVar10 = vec[lVar7].m_backend.data._M_elems + 1;
      local_e0.data._M_elems._4_8_ = *(undefined8 *)puVar10;
      local_e0.data._M_elems._12_8_ = *(undefined8 *)(puVar10 + 2);
      puVar10 = vec[lVar7].m_backend.data._M_elems + 5;
      local_e0.data._M_elems._20_8_ = *(undefined8 *)puVar10;
      local_e0.data._M_elems._28_8_ = *(undefined8 *)(puVar10 + 2);
      local_e0.data._M_elems[0] = local_168.data._M_elems[0];
      local_e0.neg = (bool)((local_168.data._M_elems[0] != 0 ||
                            local_e0.fpclass != cpp_dec_float_finite) ^ local_168.neg);
      iVar8 = local_88[local_e8];
      local_e0.exp = local_168.exp;
      if (iVar5 < iVar8) {
        piVar11 = local_98 + local_88[local_e8 + -1];
        pcVar9 = &local_90[local_88[local_e8 + -1]].m_backend;
        do {
          pcVar6 = &vec[*piVar11].m_backend;
          local_f8._0_4_ = cpp_dec_float_finite;
          local_f8._4_4_ = 10;
          local_128 = (undefined1  [16])0x0;
          local_118[0] = 0;
          local_118[1] = 0;
          stack0xfffffffffffffef0 = 0;
          uStack_10b = 0;
          _local_108 = 0;
          uStack_103 = 0;
          local_100 = 0;
          local_fc = false;
          v = pcVar6;
          if ((pcVar9 != (cpp_dec_float<50U,_int,_void> *)local_128) &&
             (v = pcVar9, (cpp_dec_float<50U,_int,_void> *)local_128 != pcVar6)) {
            uVar1 = *(undefined8 *)((pcVar6->data)._M_elems + 8);
            _local_108 = (undefined5)uVar1;
            uStack_103 = (undefined3)((ulong)uVar1 >> 0x28);
            local_128 = *(undefined1 (*) [16])(pcVar6->data)._M_elems;
            local_118._0_8_ = *(undefined8 *)((pcVar6->data)._M_elems + 4);
            uVar1 = *(undefined8 *)((pcVar6->data)._M_elems + 6);
            stack0xfffffffffffffef0 = (undefined5)uVar1;
            uStack_10b = (undefined3)((ulong)uVar1 >> 0x28);
            local_100 = pcVar6->exp;
            local_fc = pcVar6->neg;
            local_f8._0_4_ = pcVar6->fpclass;
            local_f8._4_4_ = pcVar6->prec_elem;
          }
          piVar11 = piVar11 + 1;
          pcVar9 = pcVar9 + 1;
          boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator*=
                    ((cpp_dec_float<50U,_int,_void> *)local_128,v);
          boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator+=
                    (&local_e0,(cpp_dec_float<50U,_int,_void> *)local_128);
          iVar8 = iVar8 + -1;
        } while (iVar5 < iVar8);
      }
      puVar10 = (uint *)((long)(vec->m_backend).data._M_elems + local_70);
      if (local_168.fpclass == cpp_dec_float_NaN) {
LAB_002b5571:
        local_168.data._M_elems[9] = local_e0.data._M_elems[9];
        local_168.data._M_elems[5] = local_e0.data._M_elems[5];
        local_168.data._M_elems[6] = local_e0.data._M_elems[6];
        local_168.data._M_elems[7] = local_e0.data._M_elems[7];
        local_168.data._M_elems[8] = local_e0.data._M_elems[8];
        local_168.data._M_elems[1] = local_e0.data._M_elems[1];
        local_168.data._M_elems[2] = local_e0.data._M_elems[2];
        local_168.data._M_elems[3] = local_e0.data._M_elems[3];
        local_168.data._M_elems[4] = local_e0.data._M_elems[4];
        local_168.data._M_elems[0] = local_e0.data._M_elems[0];
        local_168.prec_elem = local_e0.prec_elem;
        local_168.fpclass = local_e0.fpclass;
        local_168.neg =
             (bool)((local_e0.data._M_elems[0] != 0 || local_e0.fpclass != cpp_dec_float_finite) ^
                   local_e0.neg);
        local_168.exp = local_e0.exp;
        if (local_e0.fpclass == cpp_dec_float_NaN) {
LAB_002b55ee:
          _local_108 = (undefined5)CONCAT44(local_168.data._M_elems[9],local_168.data._M_elems[8]);
          uStack_103 = (undefined3)(local_168.data._M_elems[9] >> 8);
          local_128._8_4_ = local_168.data._M_elems[2];
          local_128._4_4_ = local_168.data._M_elems[1];
          local_118[1] = local_168.data._M_elems[5];
          local_118[0] = local_168.data._M_elems[4];
          stack0xfffffffffffffef0 =
               (undefined5)CONCAT44(local_168.data._M_elems[7],local_168.data._M_elems[6]);
          uStack_10b = (undefined3)(local_168.data._M_elems[7] >> 8);
          local_128._0_4_ = local_168.data._M_elems[0];
          local_128._12_4_ = local_168.data._M_elems[3];
          local_100 = local_168.exp;
          local_fc = local_168.neg;
          local_f8._0_4_ = local_168.fpclass;
          local_f8._4_4_ = local_168.prec_elem;
        }
        else {
          boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float<long_long>
                    ((cpp_dec_float<50U,_int,_void> *)local_128,0,(type *)0x0);
          iVar5 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::compare
                            (&local_168,(cpp_dec_float<50U,_int,_void> *)local_128);
          if (iVar5 != 0) goto LAB_002b55ee;
          local_f8._0_4_ = cpp_dec_float_finite;
          local_f8._4_4_ = 10;
          local_128 = ZEXT816(0);
          local_118[0] = 0;
          local_118[1] = 0;
          stack0xfffffffffffffef0 = 0;
          uStack_10b = 0;
          _local_108 = 0;
          uStack_103 = 0;
          local_100 = 0;
          local_fc = false;
          boost::multiprecision::backends::cpp_dec_float<50u,int,void>::operator=
                    ((cpp_dec_float<50u,int,void> *)local_128,1e-100);
        }
        *(ulong *)(puVar10 + 8) = CONCAT35(uStack_103,_local_108);
        *(undefined8 *)(puVar10 + 4) = local_118._0_8_;
        *(ulong *)(puVar10 + 6) = CONCAT35(uStack_10b,stack0xfffffffffffffef0);
        *puVar10 = local_128._0_4_;
        *(undefined8 *)(puVar10 + 1) = local_128._4_8_;
        puVar10[3] = local_128._12_4_;
        puVar10[10] = local_100;
        *(bool *)(puVar10 + 0xb) = local_fc;
        puVar10[0xc] = (fpclass_type)local_f8;
        puVar10[0xd] = local_f8._4_4_;
      }
      else {
        boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float<long_long>
                  ((cpp_dec_float<50U,_int,_void> *)local_128,0,(type *)0x0);
        iVar8 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::compare
                          (&local_168,(cpp_dec_float<50U,_int,_void> *)local_128);
        if (iVar8 != 0) goto LAB_002b5571;
        local_168.data._M_elems[9] = local_e0.data._M_elems[9];
        local_168.data._M_elems[5] = local_e0.data._M_elems[5];
        local_168.data._M_elems[6] = local_e0.data._M_elems[6];
        local_168.data._M_elems[7] = local_e0.data._M_elems[7];
        local_168.data._M_elems[8] = local_e0.data._M_elems[8];
        local_168.data._M_elems[1] = local_e0.data._M_elems[1];
        local_168.data._M_elems[2] = local_e0.data._M_elems[2];
        local_168.data._M_elems[3] = local_e0.data._M_elems[3];
        local_168.data._M_elems[4] = local_e0.data._M_elems[4];
        local_168.data._M_elems[0] = local_e0.data._M_elems[0];
        bVar12 = local_e0.data._M_elems[0] != 0 || local_e0.fpclass != cpp_dec_float_finite;
        local_168.neg = (bool)(local_e0.neg ^ bVar12);
        local_168.exp = local_e0.exp;
        local_168.prec_elem = local_e0.prec_elem;
        local_168.fpclass = local_e0.fpclass;
        _local_108 = (undefined5)CONCAT44(local_e0.data._M_elems[9],local_168.data._M_elems[8]);
        uStack_103 = (undefined3)(local_e0.data._M_elems[9] >> 8);
        local_118[1] = local_168.data._M_elems[5];
        local_118[0] = local_168.data._M_elems[4];
        stack0xfffffffffffffef0 =
             (undefined5)CONCAT44(local_168.data._M_elems[7],local_168.data._M_elems[6]);
        uStack_10b = local_e0.data._M_elems[7]._1_3_;
        local_128._4_4_ = local_e0.data._M_elems[1];
        local_128._8_4_ = local_e0.data._M_elems[2];
        local_128._0_4_ = local_e0.data._M_elems[0];
        local_128._12_4_ = local_168.data._M_elems[3];
        local_68.data._M_elems._0_8_ = *(undefined8 *)(local_a0->m_backend).data._M_elems;
        local_68.data._M_elems._8_8_ = *(undefined8 *)((local_a0->m_backend).data._M_elems + 2);
        local_68.data._M_elems._16_8_ = *(undefined8 *)((local_a0->m_backend).data._M_elems + 4);
        local_68.data._M_elems._24_8_ = *(undefined8 *)((local_a0->m_backend).data._M_elems + 6);
        local_68.data._M_elems._32_8_ = *(undefined8 *)((local_a0->m_backend).data._M_elems + 8);
        local_68.exp = (local_a0->m_backend).exp;
        local_68.neg = (local_a0->m_backend).neg;
        local_68.fpclass = (local_a0->m_backend).fpclass;
        local_68.prec_elem = (local_a0->m_backend).prec_elem;
        local_100 = local_e0.exp;
        local_f8._4_4_ = local_e0.prec_elem;
        local_f8._0_4_ = local_e0.fpclass;
        local_fc = local_168.neg;
        if ((local_e0.neg != bVar12) &&
           (local_e0.data._M_elems[0] != 0 || local_e0.fpclass != cpp_dec_float_finite)) {
          local_fc = (bool)(local_168.neg ^ 1);
        }
        if ((local_68.fpclass != cpp_dec_float_NaN && local_e0.fpclass != cpp_dec_float_NaN) &&
           (iVar8 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::compare
                              ((cpp_dec_float<50U,_int,_void> *)local_128,&local_68), 0 < iVar8)) {
          lVar7 = (long)local_16c;
          local_16c = local_16c + 1;
          local_a8[lVar7] = iVar5;
          *(ulong *)(puVar10 + 8) = CONCAT44(local_168.data._M_elems[9],local_168.data._M_elems[8]);
          *(ulong *)(puVar10 + 4) = CONCAT44(local_168.data._M_elems[5],local_168.data._M_elems[4]);
          *(ulong *)(puVar10 + 6) = CONCAT44(local_168.data._M_elems[7],local_168.data._M_elems[6]);
          *(ulong *)puVar10 = CONCAT44(local_168.data._M_elems[1],local_168.data._M_elems[0]);
          *(ulong *)(puVar10 + 2) = CONCAT44(local_168.data._M_elems[3],local_168.data._M_elems[2]);
          puVar10[10] = local_168.exp;
          *(bool *)(puVar10 + 0xb) = local_168.neg;
          puVar10[0xc] = local_168.fpclass;
          puVar10[0xd] = local_168.prec_elem;
        }
      }
      local_e8 = local_e8 + -1;
    } while (local_78 < local_e8);
  }
  return local_16c;
}

Assistant:

int CLUFactor<R>::solveUpdateLeft(R eps, R* vec, int* nonz, int n)
{
   int i, j, k, end;
   R y;
   R* lval, *val;
   int* lrow, *lidx, *idx;
   int* lbeg;

   assert(!l.updateType);               /* no Forest-Tomlin Updates! */

   lval = l.val.data();
   lidx = l.idx;
   lrow = l.row;
   lbeg = l.start;

   end = l.firstUpdate;

   for(i = l.firstUnused - 1; i >= end; --i)
   {
      k = lbeg[i];
      assert(k >= 0 && k < l.size);
      val = &lval[k];
      idx = &lidx[k];

      k = lrow[i];

      y = vec[k];
      StableSum<R> tmp(-y);

      for(j = lbeg[i + 1]; j > k; --j)
      {
         assert(*idx >= 0 && *idx < thedim);
         tmp += vec[*idx++] * (*val++);
      }

      if(y == 0)
      {
         y = -R(tmp);

         if(isNotZero(y, eps))
         {
            nonz[n++] = k;
            vec[k] = y;
         }
      }
      else
      {
         y = -R(tmp);
         vec[k] = (y != 0) ? y : SOPLEX_FACTOR_MARKER;
      }
   }

   return n;
}